

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bstrnicmp(bstring b0,bstring b1,int n)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  __int32_t **pp_Var9;
  uint uVar10;
  uchar uVar11;
  ulong uVar12;
  byte bVar13;
  
  iVar8 = -0x8000;
  if ((((b0 != (bstring)0x0) && (puVar5 = b0->data, puVar5 != (uchar *)0x0)) &&
      (uVar3 = b0->slen, b1 != (bstring)0x0 && -1 < (int)uVar3)) &&
     ((puVar6 = b1->data, puVar6 != (uchar *)0x0 && (uVar4 = b1->slen, -1 < (int)(uVar4 | n))))) {
    uVar10 = n;
    if ((int)uVar3 < n) {
      uVar10 = uVar3;
    }
    if ((int)uVar4 <= (int)uVar10) {
      uVar10 = uVar4;
    }
    if (0 < (int)uVar10 && puVar5 != puVar6) {
      uVar12 = 0;
      do {
        bVar1 = puVar5[uVar12];
        bVar13 = bVar1;
        if (-1 < (long)(char)bVar1) {
          pp_Var9 = __ctype_tolower_loc();
          bVar13 = *(byte *)(*pp_Var9 + (char)bVar1);
        }
        bVar2 = puVar6[uVar12];
        bVar7 = bVar2;
        if (-1 < (long)(char)bVar2) {
          pp_Var9 = __ctype_tolower_loc();
          bVar7 = *(byte *)(*pp_Var9 + (char)bVar2);
        }
        if (bVar13 != bVar7) {
          return (uint)bVar1 - (uint)bVar2;
        }
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
    iVar8 = 0;
    if (uVar3 != uVar4 && uVar10 != n) {
      if ((int)uVar10 < (int)uVar3) {
        uVar11 = puVar5[(int)uVar10];
        if (-1 < (long)(char)uVar11) {
          pp_Var9 = __ctype_tolower_loc();
          uVar11 = (uchar)(*pp_Var9)[(char)uVar11];
        }
        iVar8 = 0x100;
        if (uVar11 != '\0') {
          iVar8 = (int)(char)uVar11;
        }
      }
      else {
        uVar11 = puVar6[(int)uVar10];
        if (-1 < (long)(char)uVar11) {
          pp_Var9 = __ctype_tolower_loc();
          uVar11 = (uchar)(*pp_Var9)[(char)uVar11];
        }
        if (uVar11 == '\0') {
          iVar8 = -0x100;
        }
        else {
          iVar8 = -(int)(char)uVar11;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int bstrnicmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0 || n < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v  = (char) downcase (b0->data[i]);
			v -= (char) downcase (b1->data[i]);
			if (v != 0) return b0->data[i] - b1->data[i];
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) {
		v = (char) downcase (b0->data[m]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}

	v = - (char) downcase (b1->data[m]);
	if (v) return v;
	return - (int) (UCHAR_MAX + 1);
}